

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.cpp
# Opt level: O1

void __thiscall CCharacterCore::Move(CCharacterCore *this)

{
  CWorldCore *pCVar1;
  CCharacterCore *pCVar2;
  int iVar3;
  vec2 vVar4;
  int p;
  long lVar5;
  vec2 vVar6;
  int iVar7;
  long in_FS_OFFSET;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar13;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar14;
  vec2 NewPos;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_40;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_pWorld != (CWorldCore *)0x0) {
    fVar8 = (this->m_Vel).field_0.x;
    fVar11 = (this->m_Vel).field_1.y;
    fVar8 = fVar8 * fVar8 + fVar11 * fVar11;
    if (fVar8 < 0.0) {
      fVar8 = sqrtf(fVar8);
    }
    else {
      fVar8 = SQRT(fVar8);
    }
    pCVar1 = this->m_pWorld;
    fVar10 = (float)(pCVar1->m_Tuning).m_VelrampStart.m_Value / 100.0;
    fVar11 = 1.0;
    if (fVar10 <= fVar8 * 50.0) {
      fVar11 = powf((float)(pCVar1->m_Tuning).m_VelrampCurvature.m_Value / 100.0,
                    (fVar8 * 50.0 - fVar10) /
                    ((float)(pCVar1->m_Tuning).m_VelrampRange.m_Value / 100.0));
      fVar11 = 1.0 / fVar11;
    }
    (this->m_Vel).field_0.x = (this->m_Vel).field_0.x * fVar11;
    _local_40 = this->m_Pos;
    CCollision::MoveBox(this->m_pCollision,(vec2 *)&local_40,&this->m_Vel,(vec2)0x41e0000041e00000,
                        0.0,&this->m_Death);
    (this->m_Vel).field_0.x = (1.0 / fVar11) * (this->m_Vel).field_0.x;
    fVar8 = (float)(this->m_pWorld->m_Tuning).m_PlayerCollision.m_Value / 100.0;
    if ((fVar8 != 0.0) || (NAN(fVar8))) {
      fVar8 = (this->m_Pos).field_0.x - local_40.x;
      fVar11 = (this->m_Pos).field_1.y - aStack_3c.y;
      fVar8 = fVar8 * fVar8 + fVar11 * fVar11;
      if (fVar8 < 0.0) {
        fVar8 = sqrtf(fVar8);
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      if (0 < (int)(fVar8 + 1.0)) {
        vVar6 = this->m_Pos;
        iVar7 = 0;
        do {
          fVar12 = (float)iVar7 / fVar8;
          fVar11 = (this->m_Pos).field_0.x;
          fVar10 = (this->m_Pos).field_1.y;
          aVar13.x = fVar12 * (local_40.x - fVar11) + fVar11;
          aVar14.y = fVar12 * (local_40.y - fVar10) + fVar10;
          lVar5 = 0;
          do {
            pCVar2 = this->m_pWorld->m_apCharacters[lVar5];
            iVar3 = 7;
            if (pCVar2 != this && pCVar2 != (CCharacterCore *)0x0) {
              fVar11 = aVar13.x - (pCVar2->m_Pos).field_0.x;
              fVar10 = aVar14.y - (pCVar2->m_Pos).field_1.y;
              fVar11 = fVar11 * fVar11 + fVar10 * fVar10;
              if (fVar11 < 0.0) {
                fVar11 = sqrtf(fVar11);
              }
              else {
                fVar11 = SQRT(fVar11);
              }
              iVar3 = 0;
              if ((fVar11 < 28.0) && (iVar3 = 0, 0.0 <= fVar11)) {
                vVar4 = vVar6;
                if (fVar12 <= 0.0) {
                  fVar10 = local_40.x - (pCVar2->m_Pos).field_0.x;
                  fVar9 = aStack_3c.y - (pCVar2->m_Pos).field_1.y;
                  fVar10 = fVar10 * fVar10 + fVar9 * fVar9;
                  if (fVar10 < 0.0) {
                    fVar10 = sqrtf(fVar10);
                  }
                  else {
                    fVar10 = SQRT(fVar10);
                  }
                  iVar3 = 1;
                  vVar4 = _local_40;
                  if (fVar10 <= fVar11) goto LAB_001d544b;
                }
                this->m_Pos = vVar4;
                iVar3 = 1;
              }
            }
LAB_001d544b:
            if ((iVar3 != 7) && (iVar3 != 0)) goto LAB_001d5466;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x40);
          iVar3 = 5;
LAB_001d5466:
          if ((iVar3 != 5) && (iVar3 != 0)) goto LAB_001d5496;
          vVar4.field_1.y = aVar14.y;
          vVar4.field_0.x = aVar13.x;
          if (iVar3 == 5) {
            vVar6 = vVar4;
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 != (int)(fVar8 + 1.0));
      }
    }
    this->m_Pos = _local_40;
  }
LAB_001d5496:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CCharacterCore::Move()
{
	if(!m_pWorld)
		return;

	float RampValue = VelocityRamp(length(m_Vel)*50, m_pWorld->m_Tuning.m_VelrampStart, m_pWorld->m_Tuning.m_VelrampRange, m_pWorld->m_Tuning.m_VelrampCurvature);

	m_Vel.x = m_Vel.x*RampValue;

	vec2 NewPos = m_Pos;
	m_pCollision->MoveBox(&NewPos, &m_Vel, vec2(PHYS_SIZE, PHYS_SIZE), 0, &m_Death);

	m_Vel.x = m_Vel.x*(1.0f/RampValue);

	if(m_pWorld->m_Tuning.m_PlayerCollision)
	{
		// check player collision
		float Distance = distance(m_Pos, NewPos);
		int End = Distance+1;
		vec2 LastPos = m_Pos;
		for(int i = 0; i < End; i++)
		{
			float a = i/Distance;
			vec2 Pos = mix(m_Pos, NewPos, a);
			for(int p = 0; p < MAX_CLIENTS; p++)
			{
				CCharacterCore *pCharCore = m_pWorld->m_apCharacters[p];
				if(!pCharCore || pCharCore == this)
					continue;
				float D = distance(Pos, pCharCore->m_Pos);
				if(D < PHYS_SIZE && D >= 0.0f)
				{
					if(a > 0.0f)
						m_Pos = LastPos;
					else if(distance(NewPos, pCharCore->m_Pos) > D)
						m_Pos = NewPos;
					return;
				}
			}
			LastPos = Pos;
		}
	}

	m_Pos = NewPos;
}